

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

ScriptContext * __thiscall Js::EntryPointInfo::GetScriptContext(EntryPointInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptLibrary *this_00;
  ScriptContext *pSVar4;
  EntryPointInfo *this_local;
  
  bVar2 = IsCleanedUp(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x164,"(!IsCleanedUp())","!IsCleanedUp()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator->(&this->library);
  pSVar4 = JavascriptLibrary::GetScriptContext(this_00);
  return pSVar4;
}

Assistant:

ScriptContext* EntryPointInfo::GetScriptContext()
    {
        Assert(!IsCleanedUp());
        return this->library->GetScriptContext();
    }